

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcProxy::IfcProxy(IfcProxy *this)

{
  *(undefined ***)&this->field_0x158 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcProxy";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__007f8db0);
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x7f8cd0;
  *(undefined8 *)&this->field_0x158 = 0x7f8d98;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x7f8cf8;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7f8d20;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x7f8d48;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x7f8d70;
  *(undefined1 **)&(this->super_IfcProduct).field_0x110 = &this->field_0x120;
  *(undefined8 *)&this->field_0x118 = 0;
  this->field_0x120 = 0;
  (this->Tag).ptr._M_dataplus._M_p = (pointer)&(this->Tag).ptr.field_2;
  (this->Tag).ptr._M_string_length = 0;
  (this->Tag).ptr.field_2._M_local_buf[0] = '\0';
  (this->Tag).have = false;
  return;
}

Assistant:

IfcProxy() : Object("IfcProxy") {}